

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Shift
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,double shiftX,double shiftY)

{
  uchar *puVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  uchar *puVar7;
  imageException *this;
  uint uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *puVar13;
  uint uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  size_t __n;
  uchar *__s;
  int iVar23;
  uchar *puVar24;
  long lVar25;
  double dVar26;
  double dVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined8 in_XMM0_Qb;
  undefined1 auVar30 [16];
  undefined8 in_XMM1_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 in_ZMM4 [64];
  ImageTemplate<unsigned_char> local_58;
  
  auVar32 = in_ZMM4._0_16_;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  auVar28._8_8_ = in_XMM0_Qb;
  auVar28._0_8_ = shiftX;
  auVar29._8_8_ = in_XMM1_Qb;
  auVar29._0_8_ = shiftY;
  auVar36._8_8_ = 0x7fffffffffffffff;
  auVar36._0_8_ = 0x7fffffffffffffff;
  auVar28 = vandpd_avx512vl(auVar28,auVar36);
  auVar36 = vcvtusi2sd_avx512f(auVar32,width - 1);
  if (auVar28._0_8_ <= auVar36._0_8_) {
    auVar5._8_8_ = 0x7fffffffffffffff;
    auVar5._0_8_ = 0x7fffffffffffffff;
    auVar29 = vandpd_avx512vl(auVar29,auVar5);
    auVar36 = vcvtusi2sd_avx512f(auVar32,height - 1);
    if (auVar29._0_8_ <= auVar36._0_8_) {
      auVar36 = ZEXT816(0x3fe0000000000000);
      auVar29 = ZEXT816(0x40d0000000000000);
      __n = 0;
      uVar8 = -(int)shiftX;
      uVar14 = -(int)shiftY;
      dVar27 = (double)(int)uVar8 + shiftX;
      auVar34._8_8_ = 0;
      auVar34._0_8_ = dVar27;
      uVar3 = vcmpsd_avx512f(auVar34,ZEXT816(0),1);
      bVar4 = (bool)((byte)uVar3 & 1);
      dVar2 = (double)(int)uVar14 + shiftY;
      dVar26 = (double)((ulong)bVar4 * (long)(dVar27 + 1.0) + (ulong)!bVar4 * (long)dVar27);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = dVar2;
      uVar3 = vcmpsd_avx512f(auVar32,ZEXT816(0),1);
      bVar4 = (bool)((byte)uVar3 & 1);
      uVar6 = ~(int)shiftX;
      if (dVar27 <= 0.0) {
        uVar6 = uVar8;
      }
      dVar27 = (double)((ulong)bVar4 * (long)(dVar2 + 1.0) + (ulong)!bVar4 * (long)dVar2);
      uVar8 = ~(int)shiftY;
      if (dVar2 <= 0.0) {
        uVar8 = uVar14;
      }
      iVar20 = 0;
      uVar14 = -uVar6 - startXIn;
      if (-uVar6 < startXIn) {
        uVar14 = 0;
      }
      uVar14 = (int)uVar6 >> 0x1f & uVar14;
      uVar11 = (ulong)uVar14;
      if ((0 < (int)uVar6) &&
         (uVar22 = width + startXIn + uVar6, uVar9 = in->_width - 1, __n = (size_t)(uVar22 - uVar9),
         uVar22 < uVar9)) {
        __n = 0;
      }
      auVar30._8_8_ = 0;
      auVar30._0_8_ = dVar26 * dVar27;
      auVar28 = vfmadd213sd_fma(auVar30,auVar29,auVar36);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = (1.0 - dVar26) * dVar27;
      auVar32 = vfmadd213sd_fma(auVar31,auVar29,auVar36);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = (1.0 - dVar26) * (1.0 - dVar27);
      auVar5 = vfmadd213sd_fma(auVar33,auVar29,auVar36);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar26 * (1.0 - dVar27);
      auVar36 = vfmadd213sd_fma(auVar35,auVar29,auVar36);
      uVar9 = -uVar8 - startYIn;
      if (-uVar8 < startYIn) {
        uVar9 = 0;
      }
      uVar9 = (int)uVar8 >> 0x1f & uVar9;
      if ((0 < (int)uVar8) &&
         (uVar19 = height + startYIn + uVar8, uVar22 = in->_height - 1, iVar20 = uVar19 - uVar22,
         uVar19 < uVar22)) {
        iVar20 = 0;
      }
      iVar15 = vcvttsd2usi_avx512f(auVar28);
      uVar22 = in->_rowSize;
      uVar18 = (ulong)uVar22;
      puVar13 = in->_data;
      iVar10 = vcvttsd2usi_avx512f(auVar5);
      iVar23 = vcvttsd2usi_avx512f(auVar36);
      uVar12 = 0;
      iVar16 = vcvttsd2usi_avx512f(auVar32);
      uVar19 = out->_rowSize;
      puVar1 = out->_data;
      uVar17 = (ulong)(uVar19 * uVar9);
      lVar25 = (ulong)(startYOut * uVar19) + (ulong)startXOut;
      __s = puVar1 + uVar17 + lVar25;
      for (; uVar17 != uVar12; uVar12 = uVar12 + uVar19) {
        memset(puVar1 + uVar12 + lVar25,0,(ulong)width);
      }
      uVar21 = (ulong)(width - (uVar14 + (int)__n));
      uVar12 = (ulong)((height - (uVar9 + iVar20)) * uVar19);
      lVar25 = (long)(int)(uVar8 * uVar22 + uVar6) + uVar11 + (ulong)startXIn;
      puVar7 = __s + uVar12;
      puVar24 = puVar13 + uVar18 + startYIn * uVar22 + lVar25 + (ulong)(uVar9 * uVar22) + 1;
      puVar13 = puVar13 + lVar25 + (ulong)(startYIn * uVar22) + (ulong)(uVar9 * uVar22) + 1;
      for (; __s != puVar7; __s = __s + uVar19) {
        memset(__s,0,uVar11);
        for (lVar25 = 0; uVar11 + uVar21 != lVar25; lVar25 = lVar25 + 1) {
          __s[lVar25] = (uchar)((uint)puVar24[lVar25] * iVar10 + 0x2000 +
                                (uint)puVar13[lVar25] * iVar16 +
                                (uint)puVar24[lVar25 + -1] * iVar23 +
                                (uint)puVar13[lVar25 + -1] * iVar15 >> 0xe);
        }
        memset(__s + uVar21 + uVar11,0,__n);
        puVar24 = puVar24 + uVar18;
        puVar13 = puVar13 + uVar18;
      }
      for (uVar11 = 0; iVar20 * uVar19 != uVar11; uVar11 = uVar11 + uVar19) {
        memset(puVar1 + uVar11 + uVar17 + uVar12 + (ulong)startXOut + (ulong)(startYOut * uVar19),0,
               (ulong)width);
      }
      return;
    }
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Shift value by value bigger than ROI");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Shift( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height, double shiftX, double shiftY )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if ( (fabs(shiftX) > width - 1) || (fabs(shiftY) > height - 1) )
            throw imageException("Shift value by value bigger than ROI");

        // take a note that we use an opposite values
        int32_t shiftXIntegral = -static_cast<int32_t>( shiftX );
        int32_t shiftYIntegral = -static_cast<int32_t>( shiftY );

        shiftX = shiftX + shiftXIntegral;
        shiftY = shiftY + shiftYIntegral;

        if ( shiftX > 0.0 )
            --shiftXIntegral;

        if ( shiftY > 0.0 )
            --shiftYIntegral;

        const double coeffX = ( shiftX < 0.0 ) ? (1.0 + shiftX) : shiftX;
        const double coeffY = ( shiftY < 0.0 ) ? (1.0 + shiftY) : shiftY;

        // 2^23 = 8388608, 2^23 * 256 is a integer limit
        const uint32_t coeff0 = static_cast<uint32_t>((      coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff1 = static_cast<uint32_t>((1.0 - coeffX) * (      coeffY) * 16384 + 0.5);
        const uint32_t coeff2 = static_cast<uint32_t>((1.0 - coeffX) * (1.0 - coeffY) * 16384 + 0.5);
        const uint32_t coeff3 = static_cast<uint32_t>((      coeffX) * (1.0 - coeffY) * 16384 + 0.5);

        const uint32_t limitX = in.width()  - 1u; // we need 2 subsequent pixels so we cannot use last pixel
        const uint32_t limitY = in.height() - 1u;

        const uint32_t emptyLeftArea  = (shiftXIntegral < 0 && startXIn < static_cast<uint32_t>(-shiftXIntegral)) ?
                                        (static_cast<uint32_t>(-shiftXIntegral) - startXIn) : 0u;
        const uint32_t emptyRightArea = (shiftXIntegral > 0 && limitX < startXIn + width + static_cast<uint32_t>(shiftXIntegral)) ?
                                        (startXIn + width + static_cast<uint32_t>(shiftXIntegral) - limitX) : 0u;
        const uint32_t realWidth = width - emptyLeftArea - emptyRightArea;

        const uint32_t emptyTopArea    = (shiftYIntegral < 0 && startYIn < static_cast<uint32_t>(-shiftYIntegral)) ?
                                         (static_cast<uint32_t>(-shiftYIntegral) - startYIn) : 0u;
        const uint32_t emptyBottomArea = (shiftYIntegral > 0 && limitY < startYIn + height + static_cast<uint32_t>(shiftYIntegral)) ?
                                         (startYIn + height + static_cast<uint32_t>(shiftYIntegral) - limitY) : 0u;
        const uint32_t realHeight = height - emptyTopArea - emptyBottomArea;

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        inY += shiftXIntegral + shiftYIntegral * static_cast<int32_t>( rowSizeIn );

        const uint8_t * outYEnd = outY + emptyTopArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );

        inY += emptyTopArea * rowSizeIn;

        outYEnd = outY + realHeight * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut, inY+=rowSizeIn ) {
            const uint8_t * inX = inY;
            uint8_t * outX = outY;
            const uint8_t * outXEnd = outX + emptyLeftArea + realWidth;

            memset( outX, 0, emptyLeftArea );
            inX += emptyLeftArea;

            for( ; outX != outXEnd; ++outX ) {
                uint32_t data  = (*(inX))  * coeff0;
                data += (*(inX+rowSizeIn)) * coeff3;
                data += (*(++inX))         * coeff1; // here we increment inX
                data += (*(inX+rowSizeIn)) * coeff2;

                *outX = static_cast<uint8_t>((data + 8192) >> 14); // 8192 is 0.5 after calculations
            }

            memset( outX, 0, emptyRightArea );
        }

        outYEnd = outY + emptyBottomArea * rowSizeOut;
        for( ; outY != outYEnd; outY+=rowSizeOut )
            memset( outY, 0, width );
    }